

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_add_river(dw_map *map)

{
  uint uVar1;
  BOOL BVar2;
  uint64_t uVar3;
  bool bVar4;
  uint local_20;
  int dir;
  int maindir;
  int y;
  int x;
  dw_map *map_local;
  
  do {
    uVar3 = mt_rand(0,0x77);
    maindir = (int)uVar3;
    uVar3 = mt_rand(0,0x77);
    dir = (int)uVar3;
  } while (map->tiles[maindir][dir] != '\x04');
  uVar3 = mt_rand(0,3);
  uVar1 = (uint)uVar3;
  do {
    if (map->tiles[maindir][dir] != '\x04') {
      while( true ) {
        bVar4 = true;
        if (map->walkable[maindir][dir] == '\0') {
          bVar4 = map->tiles[maindir][dir] != '\x04';
        }
        if (!bVar4) {
          return;
        }
        map->tiles[maindir][dir] = '\x04';
        uVar3 = mt_rand(0,3);
        local_20 = (uint)uVar3;
        if (local_20 == (uVar1 ^ 1)) {
          local_20 = local_20 ^ 1;
        }
        if (local_20 == 0) {
          dir = dir + -1;
        }
        else if (local_20 == 1) {
          dir = dir + 1;
        }
        else if (local_20 == 2) {
          maindir = maindir + -1;
        }
        else if (local_20 == 3) {
          maindir = maindir + 1;
        }
        BVar2 = map_ob(maindir);
        if (BVar2 != FALSE) break;
        BVar2 = map_ob(dir);
        if (BVar2 != FALSE) {
          return;
        }
      }
      return;
    }
    if (uVar1 == 0) {
      dir = dir + -1;
    }
    else if (uVar1 == 1) {
      dir = dir + 1;
    }
    else if (uVar1 == 2) {
      maindir = maindir + -1;
    }
    else if (uVar1 == 3) {
      maindir = maindir + 1;
    }
    BVar2 = map_ob(maindir);
  } while ((BVar2 == FALSE) && (BVar2 = map_ob(dir), BVar2 == FALSE));
  return;
}

Assistant:

static void map_add_river(dw_map *map) {
    int x, y, maindir, dir;

    do {
        x = mt_rand(0, 119);
        y = mt_rand(0, 119);
    } while (map->tiles[x][y] != TILE_WATER);

    maindir = mt_rand(0, 3);
    while (map->tiles[x][y] == TILE_WATER) {

        if (maindir == 0) /* north */
            --y;
        else if (maindir == 1) /* south */
            ++y;
        else if (maindir == 2) /* west */
            --x;
        else if (maindir == 3) /* east */
            ++x;
        if (map_ob(x) || map_ob(y)) {
            return;
        }
    }
    while (map->walkable[x][y] || map->tiles[x][y] != TILE_WATER) {
        map->tiles[x][y] = TILE_WATER;
            dir = mt_rand(0, 3);
         /* keep the general direction */
        if (dir == (maindir ^ 1)) {
            dir ^= 1;
        }
        if (dir == 0) /* north */
            --y;
        else if (dir == 1) /* south */
            ++y;
        else if (dir == 2) /* west */
            --x;
        else if (dir == 3) /* east */
            ++x;

        if (map_ob(x) || map_ob(y)) {
            break;
        }
    }
}